

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResolvingDecoder.cc
# Opt level: O3

ProductionPtr __thiscall
avro::parsing::ResolvingGrammarGenerator::resolveRecords
          (ResolvingGrammarGenerator *this,NodePtr *writer,NodePtr *reader,
          map<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>_>,_std::allocator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
          *m,map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
             *m2)

{
  unsigned_long *__args;
  _func_int **pp_Var1;
  element_type *peVar2;
  shared_count sVar3;
  size_type __n;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
  __position;
  NodePtr *r;
  map<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>_>,_std::allocator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
  *pmVar4;
  map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
  *m2_00;
  long *plVar5;
  void *__buf;
  iterator iVar6;
  NodePtr *n;
  size_t __n_00;
  shared_count extraout_RDX;
  pointer ppVar7;
  value_type *pvVar8;
  long lVar9;
  ulong uVar10;
  vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *pvVar11;
  type tVar12;
  ProductionPtr PVar13;
  ProductionPtr p;
  vector<unsigned_long,_std::allocator<unsigned_long>_> fieldOrder;
  shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> defaultBinary;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  rf;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  wf;
  key_type local_128;
  element_type *local_108;
  any aStack_100;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f8;
  _Base_ptr local_d8;
  _Rb_tree<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>,_std::_Select1st<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>,_std::less<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>_>,_std::allocator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
  *local_d0;
  Symbol local_c8;
  element_type *local_b8;
  shared_count asStack_b0 [3];
  NodePtr *local_98;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  local_90;
  map<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>_>,_std::allocator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
  *local_78;
  shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  local_48;
  
  local_d0 = (_Rb_tree<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>,_std::_Select1st<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>,_std::less<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>_>,_std::allocator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
              *)m2;
  local_98 = writer;
  tVar12 = boost::
           make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>();
  local_d8 = (_Base_ptr)reader;
  fields_abi_cxx11_(&local_48,(ResolvingGrammarGenerator *)reader,(NodePtr *)tVar12.pn.pi_.pi_);
  fields_abi_cxx11_(&local_90,(ResolvingGrammarGenerator *)m,n);
  local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  __n = (**(code **)(**(long **)&(m->_M_t)._M_impl + 0x38))();
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_f8,__n);
  ppVar7 = local_48.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pmVar4 = m;
  if (local_48.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_78 = pmVar4;
      __position = std::
                   __find_if<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_long>*,std::vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_pred<avro::parsing::equalsFirst<std::__cxx11::string,unsigned_long>>>
                             (local_90.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              local_90.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,ppVar7);
      if (__position._M_current ==
          local_90.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        m2_00 = (map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
                 *)(**(code **)(**(long **)local_d8 + 0x28))(*(long **)local_d8,(int)ppVar7->second)
        ;
        getWriterProduction((ResolvingGrammarGenerator *)&local_128,local_98,m2_00);
        local_108 = (element_type *)CONCAT44(local_108._4_4_,0x1b);
        aStack_100.content = (placeholder *)0x0;
        std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
        emplace_back<avro::parsing::Symbol>
                  ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
                   (this->super_ValidatingGrammarGenerator)._vptr_ValidatingGrammarGenerator,
                   (Symbol *)&local_108);
        if ((_Base_ptr)aStack_100.content != (_Base_ptr)0x0) {
          (*(aStack_100.content)->_vptr_placeholder[1])();
        }
        pvVar11 = (vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
                  (this->super_ValidatingGrammarGenerator)._vptr_ValidatingGrammarGenerator;
        if (*(long *)&(local_128.first.px)->type_ - (long)(local_128.first.px)->_vptr_Node == 0x10)
        {
          std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
                    (pvVar11,(value_type *)(local_128.first.px)->_vptr_Node);
        }
        else {
          Symbol::indirect((Symbol *)&local_108,(ProductionPtr *)&local_128);
          std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
          emplace_back<avro::parsing::Symbol>(pvVar11,(Symbol *)&local_108);
          if ((_Base_ptr)aStack_100.content != (_Base_ptr)0x0) {
            (*(aStack_100.content)->_vptr_placeholder[1])();
          }
        }
      }
      else {
        r = (NodePtr *)
            (**(code **)(**(long **)local_d8 + 0x28))(*(long **)local_d8,(int)ppVar7->second);
        plVar5 = *(long **)&(m->_M_t)._M_impl;
        pmVar4 = (map<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>_>,_std::allocator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
                  *)(**(code **)(*plVar5 + 0x28))(plVar5,(int)(__position._M_current)->second);
        doGenerate2((ResolvingGrammarGenerator *)&local_128,local_98,r,pmVar4,
                    (map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
                     *)local_d0);
        pvVar8 = *(value_type **)&(local_128.first.px)->type_;
        lVar9 = (long)pvVar8 - (long)(local_128.first.px)->_vptr_Node >> 4;
        if (0 < lVar9) {
          pvVar11 = (vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
                    (this->super_ValidatingGrammarGenerator)._vptr_ValidatingGrammarGenerator;
          uVar10 = lVar9 + 1;
          do {
            pvVar8 = pvVar8 + -1;
            std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
                      (pvVar11,pvVar8);
            uVar10 = uVar10 - 1;
          } while (1 < uVar10);
        }
        if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_f8,
                     (iterator)
                     local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&(__position._M_current)->second);
        }
        else {
          *local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = (__position._M_current)->second;
          local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        m = local_78;
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ::_M_erase(&local_90,(iterator)__position._M_current);
      }
      boost::detail::shared_count::~shared_count(&local_128.first.pn);
      ppVar7 = ppVar7 + 1;
      pmVar4 = local_78;
    } while (ppVar7 != local_48.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_90.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_90.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_d8 = &(((_Rep_type *)&local_d0->_M_impl)->_M_impl).super__Rb_tree_header._M_header;
    ppVar7 = local_90.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      plVar5 = *(long **)&(m->_M_t)._M_impl;
      plVar5 = (long *)(**(code **)(*plVar5 + 0x28))(plVar5,(int)ppVar7->second);
      local_108 = (element_type *)*plVar5;
      aStack_100.content = (placeholder *)plVar5[1];
      if ((_Base_ptr)aStack_100.content != (_Base_ptr)0x0) {
        LOCK();
        *(int *)&((_Base_ptr)aStack_100.content)->_M_parent =
             *(int *)&((_Base_ptr)aStack_100.content)->_M_parent + 1;
        UNLOCK();
      }
      __args = &ppVar7->second;
      if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_f8,
                   (iterator)
                   local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,__args);
      }
      else {
        *local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = *__args;
        local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if (local_108->type_ == AVRO_NUM_TYPES) {
        resolveSymbol((avro *)&local_b8,(NodePtr *)&local_108);
        sVar3.pi_ = asStack_b0[0].pi_;
        peVar2 = local_b8;
        local_128.first.pn.pi_ = (sp_counted_base *)aStack_100.content;
        local_128.first.px = local_108;
        local_b8 = (element_type *)0x0;
        asStack_b0[0].pi_ = (sp_counted_base *)0x0;
        local_108 = peVar2;
        aStack_100.content = (placeholder *)sVar3.pi_;
        boost::detail::shared_count::~shared_count(&local_128.first.pn);
        boost::detail::shared_count::~shared_count(asStack_b0);
      }
      plVar5 = *(long **)&(m->_M_t)._M_impl;
      __buf = (void *)(**(code **)(*plVar5 + 0x30))(plVar5,(int)*__args);
      binaryEncoder();
      memoryOutputStream((avro *)&local_c8,0x1000);
      (*(local_128.first.px)->_vptr_Node[2])
                (local_128.first.px,CONCAT44(local_c8._4_4_,local_c8.kind_));
      GenericWriter::write((int)local_128.first.px,__buf,__n_00);
      (*(local_128.first.px)->_vptr_Node[3])();
      snapshot((avro *)&local_b8,(OutputStream *)CONCAT44(local_c8._4_4_,local_c8.kind_));
      if ((long *)CONCAT44(local_c8._4_4_,local_c8.kind_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_c8._4_4_,local_c8.kind_) + 8))();
      }
      boost::detail::shared_count::~shared_count(&local_128.first.pn);
      pvVar11 = (vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
                (this->super_ValidatingGrammarGenerator)._vptr_ValidatingGrammarGenerator;
      local_70.px = (element_type *)local_b8;
      local_70.pn.pi_ = asStack_b0[0].pi_;
      if ((_Base_ptr)asStack_b0[0].pi_ != (_Base_ptr)0x0) {
        LOCK();
        (asStack_b0[0].pi_)->use_count_ = (asStack_b0[0].pi_)->use_count_ + 1;
        UNLOCK();
      }
      Symbol::defaultStartAction((Symbol *)&local_128,&local_70);
      std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
      emplace_back<avro::parsing::Symbol>(pvVar11,(Symbol *)&local_128);
      if ((_Base_ptr)local_128.first.pn.pi_ != (_Base_ptr)0x0) {
        (*(local_128.first.pn.pi_)->_vptr_sp_counted_base[1])();
      }
      boost::detail::shared_count::~shared_count(&local_70.pn);
      local_128.first.px = local_108;
      local_128.first.pn.pi_ = (sp_counted_base *)aStack_100.content;
      if ((_Base_ptr)aStack_100.content == (_Base_ptr)0x0) {
        local_128.second.pn.pi_ = (sp_counted_base *)0x0;
      }
      else {
        LOCK();
        *(int *)(aStack_100.content + 1) = *(int *)(aStack_100.content + 1) + 1;
        UNLOCK();
        local_128.second.pn.pi_ = (sp_counted_base *)aStack_100.content;
        if ((_Base_ptr)aStack_100.content != (_Base_ptr)0x0) {
          LOCK();
          *(int *)(aStack_100.content + 1) = *(int *)(aStack_100.content + 1) + 1;
          UNLOCK();
        }
      }
      local_128.second.px = local_108;
      iVar6 = std::
              _Rb_tree<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>,_std::_Select1st<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>,_std::less<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>_>,_std::allocator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
              ::find(local_d0,&local_128);
      boost::detail::shared_count::~shared_count(&local_128.second.pn);
      boost::detail::shared_count::~shared_count(&local_128.first.pn);
      if (iVar6._M_node == local_d8) {
        doGenerate2((ResolvingGrammarGenerator *)&local_128,local_98,(NodePtr *)&local_108,
                    (map<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>_>,_std::allocator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
                     *)&local_108,
                    (map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
                     *)local_d0);
      }
      else {
        local_128.first.px = *(element_type **)(iVar6._M_node + 2);
        local_128.first.pn.pi_ = (sp_counted_base *)iVar6._M_node[2]._M_parent;
        if ((_Base_ptr)local_128.first.pn.pi_ != (_Base_ptr)0x0) {
          LOCK();
          *(int *)&((_Base_ptr)local_128.first.pn.pi_)->_M_parent =
               *(int *)&((_Base_ptr)local_128.first.pn.pi_)->_M_parent + 1;
          UNLOCK();
        }
      }
      pvVar8 = *(value_type **)&(local_128.first.px)->type_;
      pvVar11 = (vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
                (this->super_ValidatingGrammarGenerator)._vptr_ValidatingGrammarGenerator;
      lVar9 = (long)pvVar8 - (long)(local_128.first.px)->_vptr_Node >> 4;
      if (0 < lVar9) {
        uVar10 = lVar9 + 1;
        do {
          pvVar8 = pvVar8 + -1;
          std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
                    (pvVar11,pvVar8);
          uVar10 = uVar10 - 1;
        } while (1 < uVar10);
        pvVar11 = (vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
                  (this->super_ValidatingGrammarGenerator)._vptr_ValidatingGrammarGenerator;
      }
      local_c8.kind_ = sDefaultEnd;
      local_c8.extra_.content = (placeholder *)0x0;
      std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
      emplace_back<avro::parsing::Symbol>(pvVar11,&local_c8);
      if (local_c8.extra_.content != (placeholder *)0x0) {
        (*(local_c8.extra_.content)->_vptr_placeholder[1])();
      }
      boost::detail::shared_count::~shared_count(&local_128.first.pn);
      boost::detail::shared_count::~shared_count(asStack_b0);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_100);
      ppVar7 = ppVar7 + 1;
    } while (ppVar7 != local_90.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  pp_Var1 = (this->super_ValidatingGrammarGenerator)._vptr_ValidatingGrammarGenerator;
  std::
  __reverse<__gnu_cxx::__normal_iterator<avro::parsing::Symbol*,std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>
            (*pp_Var1,pp_Var1[1]);
  pvVar11 = (vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
            (this->super_ValidatingGrammarGenerator)._vptr_ValidatingGrammarGenerator;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_60,&local_f8);
  Symbol::sizeListAction((Symbol *)&local_128,&local_60);
  std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
  emplace_back<avro::parsing::Symbol>(pvVar11,(Symbol *)&local_128);
  if ((_Base_ptr)local_128.first.pn.pi_ != (_Base_ptr)0x0) {
    (*(local_128.first.pn.pi_)->_vptr_sp_counted_base[1])();
  }
  if (local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_128.first.px = (element_type *)CONCAT44(local_128.first.px._4_4_,0x21);
  local_128.first.pn.pi_ = (sp_counted_base *)0x0;
  std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
  emplace_back<avro::parsing::Symbol>
            ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
             (this->super_ValidatingGrammarGenerator)._vptr_ValidatingGrammarGenerator,
             (Symbol *)&local_128);
  if (local_128.first.pn.pi_ != (sp_counted_base *)0x0) {
    (*(local_128.first.pn.pi_)->_vptr_sp_counted_base[1])();
  }
  if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~vector(&local_90);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~vector(&local_48);
  PVar13.pn.pi_ = extraout_RDX.pi_;
  PVar13.px = (element_type *)this;
  return PVar13;
}

Assistant:

ProductionPtr ResolvingGrammarGenerator::resolveRecords(
    const NodePtr& writer, const NodePtr& reader,
    map<NodePair, ProductionPtr>& m,
    map<NodePtr, ProductionPtr>& m2)
{
    ProductionPtr result = make_shared<Production>();

    vector<pair<string, size_t> > wf = fields(writer);
    vector<pair<string, size_t> > rf = fields(reader);
    vector<size_t> fieldOrder;
    fieldOrder.reserve(reader->names());

    /*
     * We look for all writer fields in the reader. If found, recursively
     * resolve the corresponding fields. Then erase the reader field.
     * If no matching field is found for reader, arrange to skip the writer
     * field.
     */
    for (vector<pair<string, size_t> >::const_iterator it = wf.begin();
        it != wf.end(); ++it) {
        vector<pair<string, size_t> >::iterator it2 =
            find_if(rf.begin(), rf.end(),
                equalsFirst<string, size_t>(it->first));
        if (it2 != rf.end()) {
            ProductionPtr p = doGenerate2(writer->leafAt(it->second),
                reader->leafAt(it2->second), m, m2);
            copy(p->rbegin(), p->rend(), back_inserter(*result));
            fieldOrder.push_back(it2->second);
            rf.erase(it2);
        } else {
            ProductionPtr p = getWriterProduction(
                writer->leafAt(it->second), m2);
            result->push_back(Symbol::skipStart());
            if (p->size() == 1) {
                result->push_back((*p)[0]);
            } else {
                result->push_back(Symbol::indirect(p));
            }
        }
    }

    /*
     * Examine the reader fields left out, (i.e. those didn't have corresponding
     * writer field).
     */
    for (vector<pair<string, size_t> >::const_iterator it = rf.begin();
        it != rf.end(); ++it) {

        NodePtr s = reader->leafAt(it->second);
        fieldOrder.push_back(it->second);

        if (s->type() == AVRO_SYMBOLIC) {
            s = resolveSymbol(s);
        }
        shared_ptr<vector<uint8_t> > defaultBinary =
            getAvroBinary(reader->defaultValueAt(it->second));
        result->push_back(Symbol::defaultStartAction(defaultBinary));
        map<NodePair, shared_ptr<Production> >::const_iterator it2 =
            m.find(NodePair(s, s));
        ProductionPtr p = (it2 == m.end()) ?
            doGenerate2(s, s, m, m2) : it2->second;
        copy(p->rbegin(), p->rend(), back_inserter(*result));
        result->push_back(Symbol::defaultEndAction());
    }
    reverse(result->begin(), result->end());
    result->push_back(Symbol::sizeListAction(fieldOrder));
    result->push_back(Symbol::recordAction());

    return result;

}